

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O2

void __thiscall
testing::internal::FunctionMockerBase<int_(int)>::ClearDefaultActionsLocked
          (FunctionMockerBase<int_(int)> *this)

{
  pointer ppvVar1;
  OnCallSpec<int_(int)> *this_00;
  const_iterator it;
  pointer ppvVar2;
  _Vector_base<const_void_*,_std::allocator<const_void_*>_> local_38;
  
  MutexBase::AssertHeld((MutexBase *)g_gmock_mutex);
  ppvVar2 = (this->super_UntypedFunctionMockerBase).untyped_on_call_specs_.
            super__Vector_base<const_void_*,_std::allocator<const_void_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppvVar1 = (this->super_UntypedFunctionMockerBase).untyped_on_call_specs_.
            super__Vector_base<const_void_*,_std::allocator<const_void_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  local_38._M_impl.super__Vector_impl_data._M_end_of_storage =
       (this->super_UntypedFunctionMockerBase).untyped_on_call_specs_.
       super__Vector_base<const_void_*,_std::allocator<const_void_*>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (this->super_UntypedFunctionMockerBase).untyped_on_call_specs_.
  super__Vector_base<const_void_*,_std::allocator<const_void_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->super_UntypedFunctionMockerBase).untyped_on_call_specs_.
  super__Vector_base<const_void_*,_std::allocator<const_void_*>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->super_UntypedFunctionMockerBase).untyped_on_call_specs_.
  super__Vector_base<const_void_*,_std::allocator<const_void_*>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_38._M_impl.super__Vector_impl_data._M_start = ppvVar2;
  local_38._M_impl.super__Vector_impl_data._M_finish = ppvVar1;
  MutexBase::Unlock((MutexBase *)g_gmock_mutex);
  for (; ppvVar2 != ppvVar1; ppvVar2 = ppvVar2 + 1) {
    this_00 = (OnCallSpec<int_(int)> *)*ppvVar2;
    if (this_00 != (OnCallSpec<int_(int)> *)0x0) {
      OnCallSpec<int_(int)>::~OnCallSpec(this_00);
    }
    operator_delete(this_00,0x50);
  }
  MutexBase::Lock((MutexBase *)g_gmock_mutex);
  std::_Vector_base<const_void_*,_std::allocator<const_void_*>_>::~_Vector_base(&local_38);
  return;
}

Assistant:

GTEST_EXCLUSIVE_LOCK_REQUIRED_(g_gmock_mutex) {
    g_gmock_mutex.AssertHeld();

    // Deleting our default actions may trigger other mock objects to be
    // deleted, for example if an action contains a reference counted smart
    // pointer to that mock object, and that is the last reference. So if we
    // delete our actions within the context of the global mutex we may deadlock
    // when this method is called again. Instead, make a copy of the set of
    // actions to delete, clear our set within the mutex, and then delete the
    // actions outside of the mutex.
    UntypedOnCallSpecs specs_to_delete;
    untyped_on_call_specs_.swap(specs_to_delete);

    g_gmock_mutex.Unlock();
    for (UntypedOnCallSpecs::const_iterator it =
             specs_to_delete.begin();
         it != specs_to_delete.end(); ++it) {
      delete static_cast<const OnCallSpec<F>*>(*it);
    }

    // Lock the mutex again, since the caller expects it to be locked when we
    // return.
    g_gmock_mutex.Lock();
  }